

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InlinePass::NewLabel(InlinePass *this,uint32_t label_id)

{
  Instruction *this_00;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  
  this_00 = (Instruction *)::operator_new(0x70);
  local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Instruction::Instruction
            (this_00,*(IRContext **)(CONCAT44(in_register_00000034,label_id) + 0x28),OpLabel,0,
             in_EDX,&local_38);
  (this->super_Pass)._vptr_Pass = (_func_int **)this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InlinePass::NewLabel(uint32_t label_id) {
  std::unique_ptr<Instruction> newLabel(
      new Instruction(context(), spv::Op::OpLabel, 0, label_id, {}));
  return newLabel;
}